

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O3

bool __thiscall CaptureSummary::AddLine(CaptureSummary *this,CaptureLine *line,bool need_allocation)

{
  pointer *ppp_Var1;
  iterator __position;
  CaptureLine *__dest;
  undefined7 in_register_00000011;
  _capture_line *local_20;
  
  __dest = line;
  if ((int)CONCAT71(in_register_00000011,need_allocation) != 0) {
    __dest = (CaptureLine *)operator_new(0xd0);
    memcpy(__dest,line,0xd0);
  }
  __position._M_current =
       (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_20 = __dest;
    std::vector<_capture_line*,std::allocator<_capture_line*>>::
    _M_realloc_insert<_capture_line*const&>
              ((vector<_capture_line*,std::allocator<_capture_line*>> *)&this->summary,__position,
               &local_20);
  }
  else {
    *__position._M_current = __dest;
    ppp_Var1 = &(this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppp_Var1 = *ppp_Var1 + 1;
  }
  return true;
}

Assistant:

bool CaptureSummary::AddLine(CaptureLine * line, bool need_allocation)
{
    bool ret = true;
    CaptureLine * new_line;

    if (need_allocation)
    {
        new_line = new CaptureLine;

        if (new_line == NULL)
        {
            ret = false;
        }
        else
        {
            memcpy(new_line, line, sizeof(CaptureLine));
        }
    }
    else
    {
        new_line = line;
    }

    if (ret)
    {
        summary.push_back(new_line);
    }

    return ret;
}